

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestaccessmanager.cpp
# Opt level: O0

QNetworkReply * __thiscall
QRestAccessManagerPrivate::warnNoAccessManager(QRestAccessManagerPrivate *this)

{
  bool bVar1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc8;
  QMessageLogger *in_stack_ffffffffffffffd0;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcQrest();
  anon_unknown.dwarf_7e2df3::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
            (in_RDI,in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_7e2df3::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x32c59f);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(int)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffffb8,(char *)0x32c5b5);
    QMessageLogger::warning
              (&stack0xffffffffffffffc8,"QRestAccessManager: QNetworkAccessManager not set");
    local_10 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QNetworkReply *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply* QRestAccessManagerPrivate::warnNoAccessManager()
{
    qCWarning(lcQrest, "QRestAccessManager: QNetworkAccessManager not set");
    return nullptr;
}